

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_shape_breath_code(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *code;
  player_shape *shape;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  pcVar2 = parser_getstr(p,"code");
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar1 + 0x80) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_shape_breath_code(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	const char *code = parser_getstr(p, "code");

	if (!shape)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	shape->breath_name = string_make(code);
	return PARSE_ERROR_NONE;
}